

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_update_spki_table(rtr_socket *rtr_socket,spki_table *spki_table,void *pdu)

{
  long lVar1;
  pdu_type pVar2;
  long in_FS_OFFSET;
  int local_14c;
  int rtval;
  size_t pdu_size;
  pdu_type type;
  void *pdu_local;
  spki_table *spki_table_local;
  rtr_socket *rtr_socket_local;
  char local_118 [8];
  char txt_2 [17];
  char local_f8 [8];
  char txt_1 [49];
  undefined1 local_b8 [8];
  spki_record entry;
  char txt [31];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x3ea,
                  "int rtr_update_spki_table(struct rtr_socket *, struct spki_table *, const void *)"
                 );
  }
  if (pdu == (void *)0x0) {
    __assert_fail("pdu",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x3eb,
                  "int rtr_update_spki_table(struct rtr_socket *, struct spki_table *, const void *)"
                 );
  }
  if (spki_table == (spki_table *)0x0) {
    entry.socket = (rtr_socket *)0x474e49524f4e4749;
    lrtr_dbg("RTR Socket: %s",&entry.socket);
    rtr_socket_local._4_4_ = 0;
  }
  else {
    pVar2 = rtr_get_pdu_type(pdu);
    if (pVar2 != ROUTER_KEY) {
      __assert_fail("type == ROUTER_KEY",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                    ,0x3f6,
                    "int rtr_update_spki_table(struct rtr_socket *, struct spki_table *, const void *)"
                   );
    }
    rtr_key_pdu_2_spki_record(rtr_socket,(pdu_router_key *)pdu,(spki_record *)local_b8,ROUTER_KEY);
    if (*(char *)((long)pdu + 2) == '\x01') {
      local_14c = spki_table_add_entry(spki_table,(spki_record *)local_b8);
    }
    else {
      if (*(char *)((long)pdu + 2) != '\0') {
        memcpy(local_f8,"Router Key PDU with invalid flags value received",0x31);
        lrtr_dbg("RTR Socket: %s",local_f8);
        rtr_send_error_pdu_from_host(rtr_socket,pdu,0x7b,CORRUPT_DATA,local_f8,0x31);
        rtr_socket_local._4_4_ = -1;
        goto LAB_00111020;
      }
      local_14c = spki_table_remove_entry(spki_table,(spki_record *)local_b8);
    }
    if (local_14c == -2) {
      lrtr_dbg("RTR Socket: Duplicate Announcement for router key: ASN: %u received",
               (ulong)(uint)entry.ski._12_4_);
      rtr_send_error_pdu_from_host(rtr_socket,pdu,0x7b,DUPLICATE_ANNOUNCEMENT,(char *)0x0,0);
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
      rtr_socket_local._4_4_ = -1;
    }
    else if (local_14c == -3) {
      lrtr_dbg("RTR Socket: Withdrawal of unknown router key");
      rtr_send_error_pdu_from_host(rtr_socket,pdu,0x7b,WITHDRAWAL_OF_UNKNOWN_RECORD,(char *)0x0,0);
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
      rtr_socket_local._4_4_ = -1;
    }
    else if (local_14c == -1) {
      builtin_strncpy(local_118,"spki_tab",8);
      builtin_strncpy(txt_2,"le Error",9);
      lrtr_dbg("RTR Socket: %s",local_118);
      rtr_send_error_pdu_from_host(rtr_socket,(void *)0x0,0,INTERNAL_ERROR,local_118,0x11);
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
      rtr_socket_local._4_4_ = -1;
    }
    else {
      rtr_socket_local._4_4_ = 0;
    }
  }
LAB_00111020:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return rtr_socket_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_update_spki_table(struct rtr_socket *rtr_socket, struct spki_table *spki_table, const void *pdu)
{
	assert(rtr_socket);
	assert(pdu);

	// No spki table configured hence we ignore incoming BGPSec Keys
	if (spki_table == NULL) {
		const char txt[] = "IGNORING INCOMING SPKI OBJECTS";
		RTR_DBG("%s", txt);
		return RTR_SUCCESS;
	}

	const enum pdu_type type = rtr_get_pdu_type(pdu);

	assert(type == ROUTER_KEY);

	struct spki_record entry;

	size_t pdu_size = sizeof(struct pdu_router_key);

	rtr_key_pdu_2_spki_record(rtr_socket, pdu, &entry, type);

	int rtval;

	if (((struct pdu_router_key *)pdu)->flags == 1) {
		rtval = spki_table_add_entry(spki_table, &entry);

	} else if (((struct pdu_router_key *)pdu)->flags == 0) {
		rtval = spki_table_remove_entry(spki_table, &entry);

	} else {
		const char txt[] = "Router Key PDU with invalid flags value received";

		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, CORRUPT_DATA, txt, sizeof(txt));
		return RTR_ERROR;
	}

	if (rtval == SPKI_DUPLICATE_RECORD) {
		// TODO: This debug message isn't working yet, how to display SKI/SPKI without %x?
		RTR_DBG("Duplicate Announcement for router key: ASN: %u received", entry.asn);
		rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, DUPLICATE_ANNOUNCEMENT, NULL, 0);
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	} else if (rtval == SPKI_RECORD_NOT_FOUND) {
		RTR_DBG1("Withdrawal of unknown router key");
		rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, WITHDRAWAL_OF_UNKNOWN_RECORD, NULL, 0);
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	} else if (rtval == SPKI_ERROR) {
		const char txt[] = "spki_table Error";

		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_host(rtr_socket, NULL, 0, INTERNAL_ERROR, txt, sizeof(txt));
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	}

	return RTR_SUCCESS;
}